

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::QueryVertexSeparate::createTransformFeedbackBuffer
          (QueryVertexSeparate *this)

{
  createTransformFeedbackBuffer
            ((QueryVertexSeparate *)
             ((long)&(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
             (long)(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-9]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryVertexSeparate::createTransformFeedbackBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffer object. */
	gl3cts::TransformFeedback::CaptureVertexSeparate::createTransformFeedbackBuffer();

	/* Create query object. */
	gl.genQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
}